

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O2

void __thiscall CPrintVisitor::Visit(CPrintVisitor *this,CMainClass *stm)

{
  initializer_list<INode_*> __l;
  allocator_type local_c9;
  _Vector_base<INode_*,_std::allocator<INode_*>_> local_c8;
  string local_b0;
  vector<INode_*,_std::allocator<INode_*>_> children;
  ChildrenAnswers answers;
  ChildrenAnswers local_40;
  
  answers.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(stm->id)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
                super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
                super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  answers.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(stm->mainMethod)._M_t.
                super___uniq_ptr_impl<CMainMethod,_std::default_delete<CMainMethod>_>._M_t.
                super__Tuple_impl<0UL,_CMainMethod_*,_std::default_delete<CMainMethod>_>.
                super__Head_base<0UL,_CMainMethod_*,_false>._M_head_impl;
  __l._M_len = 2;
  __l._M_array = (iterator)&answers;
  std::vector<INode_*,_std::allocator<INode_*>_>::vector(&children,__l,&local_c9);
  std::vector<INode_*,_std::allocator<INode_*>_>::vector
            ((vector<INode_*,_std::allocator<INode_*>_> *)&local_c8,&children);
  VisitChildren(&answers,this,(vector<INode_*,_std::allocator<INode_*>_> *)&local_c8);
  std::_Vector_base<INode_*,_std::allocator<INode_*>_>::~_Vector_base(&local_c8);
  ChildrenAnswers::ChildrenAnswers(&local_40,&answers);
  AddChildrenAnswers(this,(ChildrenAnswers *)&local_40);
  ChildrenAnswers::~ChildrenAnswers(&local_40);
  std::__cxx11::string::string((string *)&local_b0,"MainClass",(allocator *)&local_c9);
  AddLabel(this,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  this->lastVisited = this->lastVisited + 1;
  ChildrenAnswers::~ChildrenAnswers((ChildrenAnswers *)&answers);
  std::_Vector_base<INode_*,_std::allocator<INode_*>_>::~_Vector_base
            (&children.super__Vector_base<INode_*,_std::allocator<INode_*>_>);
  return;
}

Assistant:

void CPrintVisitor::Visit(CMainClass &stm) {
	std::vector<INode*> children = { stm.id.get(), stm.mainMethod.get() };
	ChildrenAnswers answers = VisitChildren(children);
	AddChildrenAnswers(answers);
	AddLabel("MainClass");
	++lastVisited;
}